

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O1

int mbedtls_pkcs12_pbe(mbedtls_asn1_buf *pbe_params,int mode,mbedtls_cipher_type_t cipher_type,
                      mbedtls_md_type_t md_type,uchar *pwd,size_t pwdlen,uchar *data,size_t len,
                      uchar *output)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  mbedtls_cipher_info_t *cipher_info;
  size_t olen;
  uchar iv [16];
  uchar key [32];
  mbedtls_cipher_context_t cipher_ctx;
  
  olen = 0;
  cipher_info = mbedtls_cipher_info_from_type(cipher_type);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    iVar2 = -0x1f00;
  }
  else {
    uVar1 = cipher_info->key_bitlen;
    iVar2 = pkcs12_pbe_derive_key_iv
                      (pbe_params,md_type,pwd,pwdlen,key,(ulong)(uVar1 >> 3),iv,
                       (ulong)cipher_info->iv_size);
    if (iVar2 == 0) {
      mbedtls_cipher_init(&cipher_ctx);
      iVar2 = mbedtls_cipher_setup(&cipher_ctx,cipher_info);
      if ((((iVar2 == 0) &&
           (iVar2 = mbedtls_cipher_setkey(&cipher_ctx,key,uVar1 & 0xfffffff8,mode), iVar2 == 0)) &&
          (iVar2 = mbedtls_cipher_set_iv(&cipher_ctx,iv,(ulong)cipher_info->iv_size), iVar2 == 0))
         && ((iVar2 = mbedtls_cipher_reset(&cipher_ctx), iVar2 == 0 &&
             (iVar2 = mbedtls_cipher_update(&cipher_ctx,data,len,output,&olen), iVar2 == 0)))) {
        iVar3 = mbedtls_cipher_finish(&cipher_ctx,output + olen,&olen);
        iVar2 = -0x1e00;
        if (iVar3 == 0) {
          iVar2 = 0;
        }
      }
      mbedtls_platform_zeroize(key,0x20);
      mbedtls_platform_zeroize(iv,0x10);
      mbedtls_cipher_free(&cipher_ctx);
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_pkcs12_pbe( mbedtls_asn1_buf *pbe_params, int mode,
                mbedtls_cipher_type_t cipher_type, mbedtls_md_type_t md_type,
                const unsigned char *pwd,  size_t pwdlen,
                const unsigned char *data, size_t len,
                unsigned char *output )
{
    int ret, keylen = 0;
    unsigned char key[32];
    unsigned char iv[16];
    const mbedtls_cipher_info_t *cipher_info;
    mbedtls_cipher_context_t cipher_ctx;
    size_t olen = 0;

    cipher_info = mbedtls_cipher_info_from_type( cipher_type );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE );

    keylen = cipher_info->key_bitlen / 8;

    if( ( ret = pkcs12_pbe_derive_key_iv( pbe_params, md_type, pwd, pwdlen,
                                          key, keylen,
                                          iv, cipher_info->iv_size ) ) != 0 )
    {
        return( ret );
    }

    mbedtls_cipher_init( &cipher_ctx );

    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_setkey( &cipher_ctx, key, 8 * keylen, (mbedtls_operation_t) mode ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_set_iv( &cipher_ctx, iv, cipher_info->iv_size ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_reset( &cipher_ctx ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_update( &cipher_ctx, data, len,
                                output, &olen ) ) != 0 )
    {
        goto exit;
    }

    if( ( ret = mbedtls_cipher_finish( &cipher_ctx, output + olen, &olen ) ) != 0 )
        ret = MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH;

exit:
    mbedtls_platform_zeroize( key, sizeof( key ) );
    mbedtls_platform_zeroize( iv,  sizeof( iv  ) );
    mbedtls_cipher_free( &cipher_ctx );

    return( ret );
}